

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVectorTests.cpp
# Opt level: O0

void (anonymous_namespace)::
     assertEmpty<slang::SmallVector<(anonymous_namespace)::Constructable,9ul>>
               (SmallVector<(anonymous_namespace)::Constructable,_9UL> *v)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  ExprLhs<bool> EVar1;
  SmallVectorBase<(anonymous_namespace)::Constructable> *in_RDI;
  AssertionHandler catchAssertionHandler_2;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffdbc;
  AssertionHandler *in_stack_fffffffffffffdc0;
  ExprLhs<bool> *in_stack_fffffffffffffdc8;
  SourceLineInfo *this;
  AssertionHandler *in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  SourceLineInfo *this_00;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  SourceLineInfo *this_01;
  Flags in_stack_fffffffffffffdf0;
  SourceLineInfo local_1a8;
  StringRef local_198;
  undefined1 local_139;
  StringRef local_138;
  SourceLineInfo local_128;
  StringRef local_118;
  uint local_ac;
  StringRef local_80;
  SourceLineInfo local_70;
  StringRef local_60;
  SmallVectorBase<(anonymous_namespace)::Constructable> *local_8;
  
  local_8 = in_RDI;
  local_60 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffdc0,
                        CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  this_01 = &local_70;
  Catch::SourceLineInfo::SourceLineInfo
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/util/SmallVectorTests.cpp"
             ,0x70);
  local_80 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffdc0,
                        CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  uVar2 = 2;
  macroName.m_size._0_7_ = in_stack_fffffffffffffde0;
  macroName.m_start = (char *)in_stack_fffffffffffffdd8;
  macroName.m_size._7_1_ = in_stack_fffffffffffffde7;
  capturedExpression.m_size = (size_type)in_stack_fffffffffffffdd0;
  capturedExpression.m_start = &in_stack_fffffffffffffdc8->m_lhs;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffdc0,macroName,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffdbc,2),capturedExpression,
             in_stack_fffffffffffffdf0);
  local_ac = (uint)Catch::operator<=<unsigned_int,_0>
                             ((Decomposer *)CONCAT44(in_stack_fffffffffffffdbc,uVar2),0);
  slang::SmallVectorBase<(anonymous_namespace)::Constructable>::size(local_8);
  Catch::operator==((ExprLhs<unsigned_int> *)this_01,
                    CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffdc0,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffdbc,uVar2));
  Catch::AssertionHandler::complete(in_stack_fffffffffffffdc0);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffdc0);
  local_118 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffdc0,CONCAT44(in_stack_fffffffffffffdbc,uVar2)
                        );
  this_00 = &local_128;
  Catch::SourceLineInfo::SourceLineInfo
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/util/SmallVectorTests.cpp"
             ,0x71);
  local_138 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffdc0,CONCAT44(in_stack_fffffffffffffdbc,uVar2)
                        );
  uVar2 = 2;
  macroName_00.m_size._0_7_ = in_stack_fffffffffffffde0;
  macroName_00.m_start = (char *)this_00;
  macroName_00.m_size._7_1_ = in_stack_fffffffffffffde7;
  capturedExpression_00.m_size = (size_type)in_stack_fffffffffffffdd0;
  capturedExpression_00.m_start = &in_stack_fffffffffffffdc8->m_lhs;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffdc0,macroName_00,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffdbc,2),capturedExpression_00,
             in_stack_fffffffffffffdf0);
  slang::SmallVectorBase<(anonymous_namespace)::Constructable>::empty(local_8);
  EVar1 = Catch::operator<=<bool,_0>((Decomposer *)CONCAT44(in_stack_fffffffffffffdbc,uVar2),false);
  local_139 = EVar1;
  Catch::AssertionHandler::handleExpr<bool>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffdc0);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffdc0);
  local_198 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffdc0,CONCAT44(in_stack_fffffffffffffdbc,uVar2)
                        );
  this = &local_1a8;
  Catch::SourceLineInfo::SourceLineInfo
            (this,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/util/SmallVectorTests.cpp"
             ,0x72);
  operator____catch_sr((char *)in_stack_fffffffffffffdc0,CONCAT44(in_stack_fffffffffffffdbc,uVar2));
  uVar2 = 2;
  macroName_01.m_size._0_7_ = in_stack_fffffffffffffde0;
  macroName_01.m_start = (char *)this_00;
  macroName_01.m_size._7_1_ = EVar1.m_lhs;
  capturedExpression_01.m_size = (size_type)in_stack_fffffffffffffdd0;
  capturedExpression_01.m_start = (char *)this;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffdc0,macroName_01,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffdbc,2),capturedExpression_01,
             in_stack_fffffffffffffdf0);
  slang::SmallVectorBase<(anonymous_namespace)::Constructable>::begin(local_8);
  Catch::operator<=<(anonymous_namespace)::Constructable_*,_0>
            ((Decomposer *)CONCAT44(in_stack_fffffffffffffdbc,uVar2),(Constructable **)0x88ccfb);
  slang::SmallVectorBase<(anonymous_namespace)::Constructable>::end(local_8);
  Catch::operator==((ExprLhs<(anonymous_namespace)::Constructable_*const_&> *)this_01,
                    (Constructable **)CONCAT17(EVar1.m_lhs,in_stack_fffffffffffffde0));
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffdc0,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffdbc,uVar2));
  Catch::AssertionHandler::complete(in_stack_fffffffffffffdc0);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffdc0);
  return;
}

Assistant:

void assertEmpty(TVector& v) {
    CHECK(0u == v.size());
    CHECK(v.empty());
    CHECK(v.begin() == v.end());
}